

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesWalk.h
# Opt level: O0

void __thiscall
dg::legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::processBBlockCFG
          (NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *this,LLVMNode *n)

{
  bool bVar1;
  iterator this_00;
  LLVMNode *n_00;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RSI;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *in_RDI;
  BBlockEdge *E;
  iterator __end0;
  iterator __begin0;
  SuccContainerT *__range3;
  BBlock<dg::LLVMNode> *BB;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffffb8;
  _Self local_28;
  SuccContainerT *local_20;
  BBlock<dg::LLVMNode> *local_18;
  
  local_18 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock(in_RSI);
  if (local_18 != (BBlock<dg::LLVMNode> *)0x0) {
    local_20 = BBlock<dg::LLVMNode>::successors(local_18);
    local_28._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_ffffffffffffffb8);
    this_00 = DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                        ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                         in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0), bVar1) {
      n_00 = (LLVMNode *)
             std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                       ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1bfb3d);
      BBlock<dg::LLVMNode>::getFirstNode(in_stack_ffffffffffffffb8);
      enqueue((NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)this_00._M_node,n_00);
      std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++(in_RDI);
    }
  }
  return;
}

Assistant:

void processBBlockCFG(NodeT *n) {
        BBlock<NodeT> *BB = n->getBBlock();
        if (!BB)
            return;

        for (auto &E : BB->successors())
            enqueue(E.target->getFirstNode());
    }